

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O0

void __thiscall cfd::core::ByteData::~ByteData(ByteData *this)

{
  ByteData *this_local;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return;
}

Assistant:

class CFD_CORE_EXPORT ByteData {
 public:
  /**
   * @brief default constructor.
   */
  ByteData();

  /**
   * @brief constructor
   * @param[in] vector  byte array.
   */
  ByteData(const std::vector<uint8_t>& vector);  // NOLINT

  /**
   * @brief constructor
   * @param[in] hex  hex string.
   */
  explicit ByteData(const std::string& hex);

  /**
   * @brief constructor
   * @param[in] buffer    Byte data buffer
   * @param[in] size      Byte data size
   */
  explicit ByteData(const uint8_t* buffer, uint32_t size);

  /**
   * @brief constructor
   * @param[in] single_byte    1-Byte data
   */
  explicit ByteData(const uint8_t single_byte);
  /**
   * @brief copy constructor.
   * @param[in] object    object
   * @return object
   */
  ByteData& operator=(const ByteData& object);

  /**
   * @brief Get a hex string.
   * @return hex string.
   */
  std::string GetHex() const;

  /**
   * @brief Get a byte array.
   * @return byte array.
   */
  std::vector<uint8_t> GetBytes() const;

  /**
   * @brief Get a byte data size.
   * @return byte data size.
   */
  size_t GetDataSize() const;

  /**
   * @brief Check is data empty.
   * @retval true   empty.
   * @retval false  not empty.
   * @deprecated replace to IsEmpty .
   */
  bool Empty() const;
  /**
   * @brief Check is data empty.
   * @retval true   empty.
   * @retval false  not empty.
   */
  bool IsEmpty() const;

  /**
   * @brief Check equals.
   * @param bytedata  compare target object.
   * @retval true   equals.
   * @retval false  not equals.
   */
  bool Equals(const ByteData& bytedata) const;

  /**
   * @brief Get head data only 1 byte.
   * @details empty is return 0.
   * @return 1byte data
   */
  uint8_t GetHeadData() const;

  /**
   * @brief Serialize byte data.
   * @return serialize data
   */
  ByteData Serialize() const;

  /**
   * @brief Get the serialized size.
   * @return serialize data size
   */
  size_t GetSerializeSize() const;

  /**
   * @brief Join byte data list.
   * @param[in] data  byte data.
   * @return joined byte data.
   * @deprecated refactoring.
   */
  template <class ByteDataClass>
  ByteData Join(const ByteDataClass& data) const {
    std::vector<uint8_t> result(data_);
    std::vector<uint8_t> insert_bytes = data.GetBytes();
    result.insert(result.end(), insert_bytes.begin(), insert_bytes.end());
    return ByteData(result);
  }

  /**
   * @brief Join byte data list.
   * @param[in] top   top byte data.
   * @param[in] args  byte data list.
   * @return joined byte data.
   * @deprecated refactoring.
   */
  template <class ByteTop, class... ByteDataClass>
  ByteData Join(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Join(top);
    return result.Join(args...);
  }

  /**
   * @brief Push to back.
   * @param[in] back_insert_data  back insert data.
   * @return joined byte data.
   * @deprecated refactoring.
   */
  template <class ByteDataClass>
  ByteData PushBack(const ByteDataClass& back_insert_data) const {
    std::vector<uint8_t> result(data_);
    std::vector<uint8_t> insert_bytes = back_insert_data.GetBytes();
    result.insert(result.end(), insert_bytes.begin(), insert_bytes.end());
    return ByteData(result);
  }

  /**
   * @brief Join byte data list.
   * @param[in] data  byte data.
   * @return joined byte data.
   */
  template <class ByteDataClass>
  ByteData Concat(const ByteDataClass& data) const {
    std::vector<uint8_t> result(data_);
    std::vector<uint8_t> insert_bytes = data.GetBytes();
    result.insert(result.end(), insert_bytes.begin(), insert_bytes.end());
    return ByteData(result);
  }

  /**
   * @brief Join byte data list.
   * @param[in] top   top byte data.
   * @param[in] args  byte data list.
   * @return joined byte data.
   */
  template <class ByteTop, class... ByteDataClass>
  ByteData Concat(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Concat(top);
    return result.Concat(args...);
  }

  /**
   * @brief Split a byte data.
   * @param[in] split_size_list   split size list.
   * @return split byte data list.
   */
  std::vector<ByteData> SplitData(
      const std::vector<uint32_t>& split_size_list) const;

  /**
   * @brief Split a byte data.
   * @param[in] size_from_top     size from top.
   * @return split byte data list.
   */
  ByteData SplitData(uint32_t size_from_top) const;

  /**
   * @brief Push to back.
   * @param[in] back_insert_data  back insert data.
   */
  void Push(const ByteData& back_insert_data);
  /**
   * @brief Push to back.
   * @param[in] back_insert_data  back insert data.
   */
  void Push(const ByteData160& back_insert_data);
  /**
   * @brief Push to back.
   * @param[in] back_insert_data  back insert data.
   */
  void Push(const ByteData256& back_insert_data);

  /**
   * @brief Equals operator.
   * @param[in] object  target object.
   * @retval true   equals
   * @retval false  not equals
   */
  bool operator==(const ByteData& object) const;

  /**
   * @brief Get the variable integer buffer.
   * @param[in] value    size value
   * @return variable size buffer
   */
  static ByteData GetVariableInt(uint64_t value);

  /**
   * @brief Compare the HEX values ​​of the two specified buffers.
   * @param[in] source        source target
   * @param[in] destination   destination target
   * @retval true   Large
   * @retval false  Small or equals.
   */
  static bool IsLarge(const ByteData& source, const ByteData& destination);

 private:
  /**
   * @brief データbyte array.
   */
  std::vector<uint8_t> data_;
}